

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

string * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_full_name_abi_cxx11_
          (string *__return_storage_ptr__,StackNode *this)

{
  pointer pcVar1;
  size_type sVar2;
  long *plVar3;
  long *plVar4;
  StackNode *pSVar5;
  __string_type __str;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name)._M_string_length);
  pSVar5 = this->parent;
  if (pSVar5 != (StackNode *)0x0) {
    do {
      sVar2 = (pSVar5->name)._M_string_length;
      if ((sVar2 == 0) && (pSVar5->parent == (StackNode *)0x0)) {
        return __return_storage_ptr__;
      }
      pcVar1 = (pSVar5->name)._M_dataplus._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + sVar2);
      std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,
                                  (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_40 = *plVar4;
        lStack_38 = plVar3[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar4;
        local_50 = (long *)*plVar3;
      }
      local_48 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      pSVar5 = pSVar5->parent;
    } while (pSVar5 != (StackNode *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_full_name() const {
    std::string full_name = this->name;
    for (auto p = this->parent; p; p = p->parent) {
      if (p->name.empty() && !p->parent) continue;
      full_name = p->name + '/' + full_name;
    }
    return full_name;
  }